

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

cmDependInformation * __thiscall
anon_unknown.dwarf_dee419::cmLBDepend::GetDependInformation
          (cmLBDepend *this,string *file,string *extraPath)

{
  _Rb_tree_header *__x;
  size_t *psVar1;
  pointer pbVar2;
  pointer pcVar3;
  default_delete<(anonymous_namespace)::cmDependInformation> *this_00;
  undefined1 auVar4 [16];
  _Rb_tree_header *p_Var5;
  cmLBDepend *pcVar6;
  bool bVar7;
  int iVar8;
  byte extraout_var;
  iterator iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _Base_ptr *pp_Var13;
  iterator iVar14;
  cmDependInformation *__s;
  iterator iVar15;
  cmDependInformation *this_01;
  _Base_ptr p_Var16;
  _Base_ptr in_RCX;
  pointer pbVar17;
  cmDependInformation *__ptr;
  DependInformationMapType *this_02;
  _Rb_tree_node_base *p_Var18;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar19;
  string path;
  string fullPath;
  undefined1 local_a0 [32];
  DependInformationMapType *local_80;
  _Alloc_hider local_78;
  _Base_ptr local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  cmLBDepend *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = (DependInformationMapType *)&this->DirectoryToFileToPathMap;
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)local_80,extraPath);
  local_58 = this;
  if (((_Rb_tree_header *)iVar9._M_node ==
       &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header) ||
     (iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(iVar9._M_node + 2,file),
     iVar10._M_node == (_Base_ptr)&iVar9._M_node[2]._M_parent)) {
    bVar7 = cmsys::SystemTools::FileExists(file,true);
    if (!bVar7) {
      pbVar17 = (this->IncludeDirectories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar17 != pbVar2) {
        p_Var16 = (_Base_ptr)(local_a0 + 0x10);
        do {
          pcVar3 = (pbVar17->_M_dataplus)._M_p;
          local_a0._0_8_ = p_Var16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,pcVar3,pcVar3 + pbVar17->_M_string_length);
          if ((local_a0._8_8_ != 0) &&
             (in_RCX = (_Base_ptr)local_a0._0_8_,
             *(char *)(local_a0._0_8_ + (local_a0._8_8_ - 1)) != '/')) {
            std::__cxx11::string::append((char *)local_a0);
          }
          std::__cxx11::string::_M_append((char *)local_a0,(ulong)(file->_M_dataplus)._M_p);
          bVar7 = cmsys::SystemTools::FileExists((string *)local_a0,true);
          if (bVar7) {
            cmsys::SystemTools::CollapseFullPath((string *)&local_78,(string *)local_a0);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                    *)local_80,extraPath);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](pmVar11,file);
            std::__cxx11::string::_M_assign((string *)pmVar12);
            if ((_Base_ptr)local_a0._0_8_ != p_Var16) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
            if (bVar7) goto LAB_0031a6bd;
          }
          else if ((_Base_ptr)local_a0._0_8_ != p_Var16) {
            operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
          }
          pbVar17 = pbVar17 + 1;
        } while (pbVar17 != pbVar2);
      }
      if (extraPath->_M_string_length != 0) {
        p_Var16 = (_Base_ptr)(local_a0 + 0x10);
        pcVar3 = (extraPath->_M_dataplus)._M_p;
        local_a0._0_8_ = p_Var16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,pcVar3,pcVar3 + extraPath->_M_string_length);
        if ((local_a0._8_8_ != 0) && (*(char *)(local_a0._0_8_ + (local_a0._8_8_ - 1)) != '/')) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_a0._0_8_,(pointer)(local_a0._0_8_ + local_a0._8_8_));
          std::__cxx11::string::append((char *)&local_50);
          std::__cxx11::string::operator=((string *)local_a0,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,file);
        std::__cxx11::string::operator=((string *)local_a0,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar7 = cmsys::SystemTools::FileExists((string *)local_a0,true);
        if (bVar7) {
          cmsys::SystemTools::CollapseFullPath((string *)&local_78,(string *)local_a0);
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                  *)local_80,extraPath);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar11,file);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((_Base_ptr)local_a0._0_8_ != p_Var16) {
            operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
          }
          if (bVar7) goto LAB_0031a6bd;
        }
        else if ((_Base_ptr)local_a0._0_8_ != p_Var16) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
        }
      }
      pp_Var13 = (_Base_ptr *)&file->_M_string_length;
      in_RCX = (_Base_ptr)file;
      goto LAB_0031a6aa;
    }
    cmsys::SystemTools::CollapseFullPath((string *)&local_78,file);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                            *)local_80,extraPath);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pmVar11,file);
    std::__cxx11::string::_M_assign((string *)pmVar12);
  }
  else {
    pp_Var13 = &iVar10._M_node[2]._M_parent;
    in_RCX = iVar10._M_node + 2;
LAB_0031a6aa:
    local_78._M_p = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,*(long *)in_RCX,(long)&(*pp_Var13)->_M_color + *(long *)in_RCX);
  }
LAB_0031a6bd:
  __x = &(local_58->DependInformationMap)._M_t._M_impl.super__Rb_tree_header;
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(local_58->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&local_78,in_RCX);
  iVar15._M_node = &__x->_M_header;
  if (((_Rb_tree_header *)iVar14._M_node != __x) &&
     (iVar8 = std::__cxx11::string::compare((string *)&local_78), iVar15 = iVar14, iVar8 < 0)) {
    iVar15._M_node = &__x->_M_header;
  }
  if ((_Rb_tree_header *)iVar15._M_node != __x) {
    __s = *(cmDependInformation **)(iVar15._M_node + 2);
    goto LAB_0031a9b3;
  }
  __s = (cmDependInformation *)operator_new(0xa0);
  p_Var5 = &(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0xa0);
  *(_Rb_tree_header **)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x10) =
       p_Var5;
  *(_Rb_tree_header **)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x18) =
       p_Var5;
  *(size_t *)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x20) = 0;
  __s->DependDone = false;
  __s->SourceFile = (cmSourceFile *)0x0;
  (__s->FullPath)._M_dataplus._M_p = (pointer)&(__s->FullPath).field_2;
  (__s->FullPath)._M_string_length = 0;
  (__s->FullPath).field_2._M_local_buf[0] = '\0';
  (__s->PathOnly)._M_dataplus._M_p = (pointer)&(__s->PathOnly).field_2;
  (__s->PathOnly)._M_string_length = 0;
  (__s->PathOnly).field_2._M_local_buf[0] = '\0';
  (__s->IncludeName)._M_dataplus._M_p = (pointer)&(__s->IncludeName).field_2;
  (__s->IncludeName)._M_string_length = 0;
  (__s->IncludeName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&__s->FullPath);
  cmsys::SystemTools::GetFilenamePath((string *)local_a0,(string *)&local_78);
  std::__cxx11::string::operator=((string *)&__s->PathOnly,(string *)local_a0);
  if ((_Base_ptr)local_a0._0_8_ != (_Base_ptr)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  std::__cxx11::string::_M_assign((string *)&__s->IncludeName);
  pcVar6 = local_58;
  iVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(local_58->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&local_78,in_RCX);
  if ((_Rb_tree_header *)iVar15._M_node == __x) {
LAB_0031a816:
    this_01 = (cmDependInformation *)operator_new(0x48);
    pp_Var13 = &(this_01->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (this_01->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)&this_01->DependDone;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pp_Var13,local_78._M_p,local_78._M_p + (long)&local_70->_M_color);
    this_02 = &pcVar6->DependInformationMap;
    (this_01->FullPath)._M_dataplus._M_p = (pointer)0x0;
    if ((_Rb_tree_header *)iVar15._M_node == __x) {
      if (((pcVar6->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (__ptr = (cmDependInformation *)pp_Var13,
         iVar8 = std::__cxx11::string::compare
                           ((string *)
                            ((pcVar6->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_right + 1)), -1 < iVar8)) {
LAB_0031a925:
        __ptr = (cmDependInformation *)pp_Var13;
        pVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                 ::_M_get_insert_unique_pos(&this_02->_M_t,(key_type *)pp_Var13);
      }
      else {
        p_Var16 = (pcVar6->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_right;
LAB_0031a93d:
        auVar4._8_8_ = 0;
        auVar4._0_8_ = p_Var16;
        pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar4 << 0x40);
      }
    }
    else {
      __ptr = (cmDependInformation *)(iVar15._M_node + 1);
      local_80 = this_02;
      iVar8 = std::__cxx11::string::compare((string *)pp_Var13);
      if (iVar8 < 0) {
        p_Var16 = (pcVar6->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        pVar19.second = p_Var16;
        pVar19.first = p_Var16;
        if (p_Var16 != iVar15._M_node) {
          p_Var16 = (_Base_ptr)std::_Rb_tree_decrement(iVar15._M_node);
          __ptr = (cmDependInformation *)pp_Var13;
          iVar8 = std::__cxx11::string::compare((string *)(p_Var16 + 1));
          this_02 = local_80;
          if (-1 < iVar8) goto LAB_0031a925;
          iVar14 = iVar15;
          if (p_Var16->_M_right == (_Base_ptr)0x0) {
            iVar14._M_node = (_Base_ptr)0x0;
            iVar15._M_node = p_Var16;
          }
LAB_0031a950:
          pVar19.second = iVar15._M_node;
          pVar19.first = iVar14._M_node;
        }
      }
      else {
        __ptr = (cmDependInformation *)pp_Var13;
        iVar8 = std::__cxx11::string::compare((string *)(iVar15._M_node + 1));
        if (iVar8 < 0) {
          p_Var16 = (pcVar6->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_right;
          if (p_Var16 == iVar15._M_node) goto LAB_0031a93d;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(iVar15._M_node);
          __ptr = (cmDependInformation *)(p_Var16 + 1);
          iVar8 = std::__cxx11::string::compare((string *)pp_Var13);
          this_02 = local_80;
          if (iVar8 < 0) {
            iVar14._M_node = (iVar15._M_node)->_M_right;
            if ((iVar15._M_node)->_M_right != (_Base_ptr)0x0) {
              iVar14._M_node = p_Var16;
              iVar15._M_node = p_Var16;
            }
            goto LAB_0031a950;
          }
          goto LAB_0031a925;
        }
        pVar19.second = (_Rb_tree_node_base *)0x0;
        pVar19.first = iVar15._M_node;
      }
    }
    p_Var18 = pVar19.second;
    iVar15._M_node = pVar19.first;
    if (p_Var18 == (_Rb_tree_node_base *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
      ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                      *)this_01,(_Link_type)__ptr);
    }
    else {
      bVar7 = true;
      if (((cmDependInformation *)iVar15._M_node == (cmDependInformation *)0x0) &&
         (__x != (_Rb_tree_header *)p_Var18)) {
        std::__cxx11::string::compare((string *)pp_Var13);
        bVar7 = (bool)(extraout_var >> 7);
      }
      __ptr = this_01;
      std::_Rb_tree_insert_and_rebalance
                (bVar7,(_Rb_tree_node_base *)this_01,p_Var18,&__x->_M_header);
      psVar1 = &(local_58->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar1 = *psVar1 + 1;
      iVar15._M_node = (_Base_ptr)this_01;
    }
  }
  else {
    __ptr = (cmDependInformation *)(iVar15._M_node + 1);
    iVar8 = std::__cxx11::string::compare((string *)&local_78);
    if (iVar8 < 0) goto LAB_0031a816;
  }
  this_00 = (default_delete<(anonymous_namespace)::cmDependInformation> *)
            (((cmDependInformation *)iVar15._M_node)->FullPath)._M_dataplus._M_p;
  (((cmDependInformation *)iVar15._M_node)->FullPath)._M_dataplus._M_p = (pointer)__s;
  if (this_00 != (default_delete<(anonymous_namespace)::cmDependInformation> *)0x0) {
    std::default_delete<(anonymous_namespace)::cmDependInformation>::operator()(this_00,__ptr);
  }
LAB_0031a9b3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  return __s;
}

Assistant:

cmDependInformation* GetDependInformation(const std::string& file,
                                            const std::string& extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    auto result = this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second.get();
    }
    // Didn't find an instance.  Create a new one and save it.
    auto info = cm::make_unique<cmDependInformation>();
    auto* ptr = info.get();
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = std::move(info);
    return ptr;
  }